

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsplitscb(bstring str,bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  charField chrs;
  charField cStack_68;
  
  uVar1 = 0xffffffff;
  if ((((-1 < pos) && (str != (bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     ((splitStr != (bstring)0x0 && pos <= str->slen && (iVar2 = splitStr->slen, -1 < iVar2)))) {
    if (iVar2 == 1) {
      iVar2 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar2;
    }
    if (iVar2 == 0) {
      uVar1 = (*cb)(parm,0,str->slen);
      uVar1 = uVar1 & (int)uVar1 >> 0x1f;
    }
    else {
      buildCharField(&cStack_68,splitStr);
      do {
        uVar1 = str->slen;
        uVar5 = pos;
        if (pos < (int)uVar1) {
          pbVar3 = str->data + (uint)pos;
          uVar4 = pos;
          do {
            uVar5 = uVar4;
            if (((uint)cStack_68.content[*pbVar3 >> 5] >> (*pbVar3 & 0x1f) & 1) != 0) break;
            uVar4 = uVar4 + 1;
            pbVar3 = pbVar3 + 1;
            uVar5 = uVar1;
          } while ((int)uVar4 < (int)uVar1);
        }
        iVar2 = (*cb)(parm,pos,uVar5 - pos);
        if (iVar2 < 0) {
          return iVar2;
        }
        pos = uVar5 + 1;
        uVar1 = 0;
      } while ((int)uVar5 < str->slen);
    }
  }
  return uVar1;
}

Assistant:

int bsplitscb (const bstring str, const bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
struct charField chrs;
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen 
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;
	if (splitStr->slen == 0) {
		if ((ret = cb (parm, 0, str->slen)) > 0) ret = 0;
		return ret;
	}

	if (splitStr->slen == 1) 
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	buildCharField (&chrs, splitStr);

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (testInCharField (&chrs, str->data[i])) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return 0;
}